

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O0

bool Gudhi::persistence_matrix::operator==
               (Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *c1,Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    *c2)

{
  ID_index IVar1;
  ID_index IVar2;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_c0;
  Entry *p2;
  Entry *p1;
  undefined1 local_a0 [8];
  Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  cc2;
  Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  cc1;
  Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *c2_local;
  Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *c1_local;
  
  if (c1 == c2) {
    c1_local._7_1_ = true;
  }
  else {
    Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::Heap_column((Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                   *)&cc2.entryPool_,c1,(Column_settings *)0x0);
    Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::Heap_column((Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                   *)local_a0,c2,(Column_settings *)0x0);
    p2 = Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
         ::_pop_pivot((Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                       *)&cc2.entryPool_);
    local_c0 = Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
               ::_pop_pivot((Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                             *)local_a0);
    while (p2 != (Entry *)0x0 &&
           local_c0 !=
           (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
            *)0x0) {
      IVar1 = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
              ::get_row_index(p2);
      IVar2 = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
              ::get_row_index(local_c0);
      if (IVar1 != IVar2) {
        New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
        ::destroy(c1->entryPool_,p2);
        New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
        ::destroy(c2->entryPool_,local_c0);
        c1_local._7_1_ = false;
        goto LAB_0019168f;
      }
      New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
      ::destroy(c1->entryPool_,p2);
      New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
      ::destroy(c2->entryPool_,local_c0);
      p2 = Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
           ::_pop_pivot((Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                         *)&cc2.entryPool_);
      local_c0 = Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                 ::_pop_pivot((Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                               *)local_a0);
    }
    if ((p2 == (Entry *)0x0) &&
       (local_c0 ==
        (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
         *)0x0)) {
      c1_local._7_1_ = true;
    }
    else if (p2 == (Entry *)0x0) {
      New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
      ::destroy(c2->entryPool_,local_c0);
      c1_local._7_1_ = false;
    }
    else {
      New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
      ::destroy(c1->entryPool_,p2);
      c1_local._7_1_ = false;
    }
LAB_0019168f:
    Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::~Heap_column((Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    *)local_a0);
    Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::~Heap_column((Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    *)&cc2.entryPool_);
  }
  return c1_local._7_1_;
}

Assistant:

bool operator==(const Heap_column& c1, const Heap_column& c2) {
    if (&c1 == &c2) return true;

    Heap_column cc1(c1), cc2(c2);
    Entry* p1 = cc1._pop_pivot();
    Entry* p2 = cc2._pop_pivot();
    while (p1 != nullptr && p2 != nullptr) {
      if (p1->get_row_index() != p2->get_row_index()) {
        c1.entryPool_->destroy(p1);
        c2.entryPool_->destroy(p2);
        return false;
      }
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if (p1->get_element() != p2->get_element()) {
          c1.entryPool_->destroy(p1);
          c2.entryPool_->destroy(p2);
          return false;
        }
      }
      c1.entryPool_->destroy(p1);
      c2.entryPool_->destroy(p2);
      p1 = cc1._pop_pivot();
      p2 = cc2._pop_pivot();
    }

    if (p1 == nullptr && p2 == nullptr) return true;
    if (p1 != nullptr) {
      c1.entryPool_->destroy(p1);
      return false;
    }
    c2.entryPool_->destroy(p2);
    return false;
  }